

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O3

Endpoint * __thiscall prometheus::Exposer::GetEndpointForUri(Exposer *this,string *uri)

{
  pointer pcVar1;
  unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
  *puVar2;
  Endpoint *pEVar3;
  _Head_base<0UL,_prometheus::detail::Endpoint_*,_false> _Var4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  __it;
  long lVar8;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  __it_00;
  anon_class_32_1_ba1d80cc_for__M_pred sameUri;
  _Head_base<0UL,_prometheus::detail::Endpoint_*,_false> local_e0;
  long local_d8;
  undefined1 local_d0 [40];
  element_type *local_a8;
  undefined1 local_a0 [16];
  __uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (uri->_M_dataplus)._M_p;
  local_d0._24_8_ = uri;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + uri->_M_string_length);
  __it_00._M_current =
       (this->endpoints_).
       super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->endpoints_).
           super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d0._32_8_ = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d0 + 0x20),local_50,local_50 + local_48);
  local_90._M_t.
  super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
  .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl =
       (tuple<prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>)
       local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_d0._32_8_,
             (undefined1 *)
             ((long)&(local_a8->super_Collectable)._vptr_Collectable + local_d0._32_8_));
  local_e0._M_head_impl = (Endpoint *)local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,
             local_90._M_t.
             super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
             .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl,
             (undefined1 *)
             (local_88 +
             (long)local_90._M_t.
                   super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
                   .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl));
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_e0._M_head_impl,
             (undefined1 *)((long)&(local_e0._M_head_impl)->server_ + local_d8));
  if (local_e0._M_head_impl != (Endpoint *)local_d0) {
    operator_delete(local_e0._M_head_impl);
  }
  local_e0._M_head_impl = (Endpoint *)local_d0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_70,local_70 + local_68);
  lVar8 = (long)puVar2 - (long)__it_00._M_current;
  local_d0._16_8_ = puVar2;
  if (0 < lVar8 >> 5) {
    lVar7 = (lVar8 >> 5) + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_e0,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar6) goto LAB_001093aa;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_e0,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar6) goto LAB_001093aa;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_e0,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar6) goto LAB_001093aa;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_e0,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar6) goto LAB_001093aa;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + -0x20;
    } while (1 < lVar7);
  }
  uVar5 = local_d0._16_8_;
  lVar8 = lVar8 >> 3;
  if (lVar8 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar8 != 2) {
      __it._M_current =
           (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
            *)uVar5;
      if ((lVar8 != 3) ||
         (bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                                *)&local_e0,__it_00), __it._M_current = __it_00._M_current, bVar6))
      goto LAB_001093aa;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)&local_e0,__it);
    if (bVar6) goto LAB_001093aa;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar6 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                      *)&local_e0,__it_00);
  __it._M_current =
       (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
        *)uVar5;
  if (bVar6) {
    __it._M_current = __it_00._M_current;
  }
LAB_001093aa:
  if (local_e0._M_head_impl != (Endpoint *)local_d0) {
    operator_delete(local_e0._M_head_impl);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90._M_t.
      super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
      .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
       )local_80) {
    operator_delete((void *)local_90._M_t.
                            super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
                            .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>.
                            _M_head_impl);
  }
  if ((undefined1 *)local_d0._32_8_ != local_a0) {
    operator_delete((void *)local_d0._32_8_);
  }
  if (__it._M_current ==
      (this->endpoints_).
      super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    detail::make_unique<prometheus::detail::Endpoint,CivetServer&,std::__cxx11::string_const&>
              ((detail *)&local_e0,
               (this->server_)._M_t.
               super___uniq_ptr_impl<CivetServer,_std::default_delete<CivetServer>_>._M_t.
               super__Tuple_impl<0UL,_CivetServer_*,_std::default_delete<CivetServer>_>.
               super__Head_base<0UL,_CivetServer_*,_false>._M_head_impl,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._24_8_)
    ;
    std::
    vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
    ::
    emplace_back<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>
              ((vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
                *)&this->endpoints_,
               (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
                *)&local_e0);
    _Var4._M_head_impl = local_e0._M_head_impl;
    if (local_e0._M_head_impl != (Endpoint *)0x0) {
      detail::Endpoint::~Endpoint(local_e0._M_head_impl);
      operator_delete(_Var4._M_head_impl);
    }
    __it._M_current =
         (this->endpoints_).
         super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  pEVar3 = ((__it._M_current)->_M_t).
           super___uniq_ptr_impl<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_prometheus::detail::Endpoint_*,_std::default_delete<prometheus::detail::Endpoint>_>
           .super__Head_base<0UL,_prometheus::detail::Endpoint_*,_false>._M_head_impl;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return pEVar3;
}

Assistant:

detail::Endpoint& Exposer::GetEndpointForUri(const std::string& uri) {
  auto sameUri = [uri](const std::unique_ptr<detail::Endpoint>& endpoint) {
    return endpoint->GetURI() == uri;
  };
  auto it = std::find_if(std::begin(endpoints_), std::end(endpoints_), sameUri);
  if (it != std::end(endpoints_)) {
    return *it->get();
  }

  endpoints_.emplace_back(detail::make_unique<detail::Endpoint>(*server_, uri));
  return *endpoints_.back().get();
}